

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

void __thiscall indk::Position::setPosition(Position *this,Position *P)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  Error *this_00;
  ulong uVar4;
  
  uVar1 = this->DimensionsCount;
  if (uVar1 <= P->DimensionsCount) {
    pfVar2 = P->X;
    pfVar3 = this->X;
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      pfVar3[uVar4] = pfVar2[uVar4];
    }
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  Error::Error(this_00,10);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void indk::Position::setPosition(const indk::Position &P) {
    if (P.getDimensionsCount() < DimensionsCount) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
    }
    for (unsigned int i = 0; i < DimensionsCount; i++) X[i] = P.getPositionValue(i);
}